

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_pipe_recv_cb(void *arg)

{
  long lVar1;
  undefined8 uVar2;
  void *pvVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  size_t sVar7;
  undefined1 local_a8 [8];
  nni_iov iov;
  char peer [64];
  int local_4c;
  void *pvStack_48;
  int pid;
  uint64_t len;
  nni_aio *rx_aio;
  nni_msg *msg;
  size_t n;
  nni_aio *pnStack_20;
  int rv;
  nni_aio *aio;
  ipc_pipe *p;
  void *arg_local;
  
  len = (long)arg + 0x270;
  aio = (nni_aio *)arg;
  p = (ipc_pipe *)arg;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x608));
  n._4_4_ = nni_aio_result((nni_aio *)len);
  if (n._4_4_ == NNG_OK) {
    msg = (nni_msg *)nni_aio_count((nni_aio *)len);
    nni_aio_iov_advance((nni_aio *)len,(size_t)msg);
    sVar7 = nni_aio_iov_count((nni_aio *)len);
    if (sVar7 != 0) {
      nng_stream_recv((nng_stream *)aio->a_count,(nng_aio *)len);
      nni_mtx_unlock((nni_mtx *)aio[3].a_iov);
      return;
    }
    if (aio[3].a_task.task_cv.mtx != (pthread_mutex_t *)0x0) {
LAB_0013177b:
      pnStack_20 = (nni_aio *)nni_list_first((nni_list *)&(aio->a_task).task_cv);
      nni_aio_list_remove(pnStack_20);
      rx_aio = (nni_aio *)aio[3].a_task.task_cv.mtx;
      aio[3].a_task.task_cv.mtx = (pthread_mutex_t *)0x0;
      msg = (nni_msg *)nni_msg_len((nni_msg *)rx_aio);
      nni_pipe_bump_rx((nni_pipe *)(aio->a_task).task_node.ln_prev,(size_t)msg);
      ipc_pipe_recv_start((ipc_pipe *)aio);
      nni_mtx_unlock((nni_mtx *)aio[3].a_iov);
      nni_aio_set_msg(pnStack_20,(nni_msg *)rx_aio);
      nni_aio_finish_sync(pnStack_20,NNG_OK,(size_t)msg);
      return;
    }
    if (*(char *)((long)&(aio->a_task).task_busy + 1) == '\x01') {
      pvStack_48 = (void *)(((ulong)*(byte *)((long)&(aio->a_task).task_busy + 2) << 0x38) +
                            ((ulong)*(byte *)((long)&(aio->a_task).task_busy + 3) << 0x30) +
                            ((ulong)(aio->a_task).task_prep << 0x28) +
                            ((ulong)(byte)(aio->a_task).field_0x2d << 0x20) +
                            (ulong)(byte)(aio->a_task).field_0x2e * 0x1000000 +
                            (ulong)(byte)(aio->a_task).field_0x2f * 0x10000 +
                            (ulong)(byte)(aio->a_task).task_mtx.mtx.__size[0] * 0x100 +
                           (ulong)(byte)(aio->a_task).task_mtx.mtx.__size[1]);
      if ((*(void **)&aio->a_timeout < pvStack_48) &&
         (lVar1._0_4_ = aio->a_timeout, lVar1._4_4_ = aio->a_result, lVar1 != 0)) {
        memset(&iov.iov_len,0,0x40);
        iVar4 = nng_stream_get_int((nng_stream *)aio->a_count,"ipc:peer-pid",&local_4c);
        if (iVar4 == 0) {
          snprintf((char *)&iov.iov_len,0x40," from PID %lu",(long)local_4c);
        }
        pvVar3 = pvStack_48;
        uVar2._0_4_ = aio->a_timeout;
        uVar2._4_4_ = aio->a_result;
        uVar5 = nni_pipe_sock_id((nni_pipe *)(aio->a_task).task_node.ln_prev);
        uVar6 = nni_pipe_id((nni_pipe *)(aio->a_task).task_node.ln_prev);
        nng_log_warn("NNG-RCVMAX",
                     "Oversize message of %lu bytes (> %lu) on socket<%u> pipe<%u> from IPC%s",
                     pvVar3,uVar2,(ulong)uVar5,(ulong)uVar6,&iov.iov_len);
        n._4_4_ = NNG_EMSGSIZE;
      }
      else {
        n._4_4_ = nni_msg_alloc((nni_msg **)&aio[3].a_task.task_cv.mtx,(size_t)pvStack_48);
        if (n._4_4_ == NNG_OK) {
          if (pvStack_48 != (void *)0x0) {
            local_a8 = (undefined1  [8])
                       nni_msg_body((nni_msg *)&(aio[3].a_task.task_cv.mtx)->__data);
            iov.iov_buf = pvStack_48;
            nni_aio_set_iov((nni_aio *)len,1,(nni_iov *)local_a8);
            nng_stream_recv((nng_stream *)aio->a_count,(nng_aio *)len);
            nni_mtx_unlock((nni_mtx *)aio[3].a_iov);
            return;
          }
          n._4_4_ = NNG_OK;
          goto LAB_0013177b;
        }
      }
    }
    else {
      n._4_4_ = NNG_EPROTO;
    }
  }
  while (pnStack_20 = (nni_aio *)nni_list_first((nni_list *)&(aio->a_task).task_cv),
        pnStack_20 != (nni_aio *)0x0) {
    nni_aio_list_remove(pnStack_20);
    nni_aio_finish_error(pnStack_20,n._4_4_);
  }
  rx_aio = (nni_aio *)aio[3].a_task.task_cv.mtx;
  aio[3].a_task.task_cv.mtx = (pthread_mutex_t *)0x0;
  nni_pipe_bump_error((nni_pipe *)(aio->a_task).task_node.ln_prev,n._4_4_);
  nni_mtx_unlock((nni_mtx *)aio[3].a_iov);
  nni_msg_free((nni_msg *)rx_aio);
  return;
}

Assistant:

static void
ipc_pipe_recv_cb(void *arg)
{
	ipc_pipe *p = arg;
	nni_aio  *aio;
	int       rv;
	size_t    n;
	nni_msg  *msg;
	nni_aio  *rx_aio = &p->rx_aio;

	nni_mtx_lock(&p->mtx);

	if ((rv = nni_aio_result(rx_aio)) != 0) {
		// Error on receive.  This has to cause an error back
		// to the user.  Also, if we had an allocated rx_msg, lets
		// toss it.
		goto error;
	}

	n = nni_aio_count(rx_aio);
	nni_aio_iov_advance(rx_aio, n);
	if (nni_aio_iov_count(rx_aio) != 0) {
		// Was this a partial read?  If so then resubmit for the rest.
		nng_stream_recv(p->conn, rx_aio);
		nni_mtx_unlock(&p->mtx);
		return;
	}

	// If we don't have a message yet, we were reading the message
	// header, which is just the length.  This tells us the size of the
	// message to allocate and how much more to expect.
	if (p->rx_msg == NULL) {
		uint64_t len;

		// Check to make sure we got msg type 1.
		if (p->rx_head[0] != 1) {
			rv = NNG_EPROTO;
			goto error;
		}

		// We should have gotten a message header.
		NNI_GET64(p->rx_head + 1, len);

		// Make sure the message payload is not too big.  If it is
		// the caller will shut down the pipe.
		if ((len > p->rcv_max) && (p->rcv_max > 0)) {
			int  pid;
			char peer[64] = "";
			if (nng_stream_get_int(
			        p->conn, NNG_OPT_PEER_PID, &pid) == 0) {
				snprintf(peer, sizeof(peer), " from PID %lu",
				    (unsigned long) pid);
			}
			nng_log_warn("NNG-RCVMAX",
			    "Oversize message of %lu bytes (> %lu) "
			    "on socket<%u> pipe<%u> from IPC%s",
			    (unsigned long) len, (unsigned long) p->rcv_max,
			    nni_pipe_sock_id(p->pipe), nni_pipe_id(p->pipe),
			    peer);
			rv = NNG_EMSGSIZE;
			goto error;
		}

		// Note that all IO on this pipe is blocked behind this
		// allocation.  We could possibly look at using a separate
		// lock for the read side in the future, so that we allow
		// transmits to proceed normally.  In practice this is
		// unlikely to be much of an issue though.
		if ((rv = nni_msg_alloc(&p->rx_msg, (size_t) len)) != 0) {
			goto error;
		}

		if (len != 0) {
			nni_iov iov;
			// Submit the rest of the data for a read -- we want to
			// read the entire message now.
			iov.iov_buf = nni_msg_body(p->rx_msg);
			iov.iov_len = (size_t) len;

			nni_aio_set_iov(rx_aio, 1, &iov);
			nng_stream_recv(p->conn, rx_aio);
			nni_mtx_unlock(&p->mtx);
			return;
		}
	}

	// Otherwise, we got a message read completely.  Let the user know the
	// good news.

	aio = nni_list_first(&p->recv_q);
	nni_aio_list_remove(aio);
	msg       = p->rx_msg;
	p->rx_msg = NULL;
	n         = nni_msg_len(msg);
	nni_pipe_bump_rx(p->pipe, n);
	ipc_pipe_recv_start(p);
	nni_mtx_unlock(&p->mtx);

	nni_aio_set_msg(aio, msg);
	nni_aio_finish_sync(aio, 0, n);
	return;

error:
	while ((aio = nni_list_first(&p->recv_q)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	msg       = p->rx_msg;
	p->rx_msg = NULL;
	nni_pipe_bump_error(p->pipe, rv);
	// Intentionally, we do not queue up another receive.
	// The protocol should notice this error and close the pipe.
	nni_mtx_unlock(&p->mtx);

	nni_msg_free(msg);
}